

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

Vector3f __thiscall
Renderer::estimatePixel(Renderer *this,Ray *ray,float tmin,float length,int iters)

{
  float n_elements;
  float in_ECX;
  undefined4 in_register_00000014;
  Vector3f VVar1;
  anon_class_40_5_71861d2b local_80;
  function<void_(int,_int)> local_58;
  undefined1 local_38 [8];
  Vector3f color;
  int iters_local;
  float length_local;
  float tmin_local;
  Ray *ray_local;
  Renderer *this_local;
  
  _length_local = (Ray *)CONCAT44(in_register_00000014,iters);
  color.m_elements[1] = in_ECX;
  color.m_elements[2] = length;
  iters_local = (int)tmin;
  ray_local = ray;
  this_local = this;
  Vector3f::Vector3f((Vector3f *)local_38,0.0);
  n_elements = color.m_elements[1];
  local_80.ray = _length_local;
  local_80.tmin = (float *)&iters_local;
  local_80.length = color.m_elements + 2;
  local_80.this = (Renderer *)ray;
  local_80.color = (Vector3f *)local_38;
  std::function<void(int,int)>::
  function<Renderer::estimatePixel(Ray_const&,float,float,int)::__0,void>
            ((function<void(int,int)> *)&local_58,&local_80);
  parallel_for((uint)n_elements,&local_58,100.0 < color.m_elements[2]);
  std::function<void_(int,_int)>::~function(&local_58);
  VVar1 = operator/((Vector3f *)this,(float)(int)color.m_elements[1]);
  return (Vector3f)VVar1.m_elements;
}

Assistant:

Vector3f Renderer::estimatePixel(const Ray &ray, float tmin, float length, int iters) {
    // Average over multiple iterations.
    Vector3f color;
    parallel_for(iters, [&](int start, int end) {
        for (int i = start; i < end; i++) {
            // 1. Choose a light
            std::default_random_engine generator(rand());
            std::uniform_int_distribution<int> uniform(0, _scene.lights.size() - 1);
            Object3D *light = _scene.lights[uniform(generator)];

            float prob_path = 1;

            std::vector<Ray> eye_path;
            std::vector<Ray> light_path;
            std::vector<Hit> eye_hits;
            std::vector<Hit> light_hits;

            choosePath(ray, light, tmin, length, prob_path, eye_path, eye_hits, light_path, light_hits);
            Vector3f path_color = colorPath(tmin, light, eye_path, eye_hits, light_path, light_hits);
            color += path_color;
        }
    }, length > 100);
    return color / (float) iters;
}